

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O1

size_t tt::detail::convert<long_long>(char *buf,longlong value)

{
  char cVar1;
  longlong lVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  lVar2 = value;
  pcVar5 = buf;
  do {
    pcVar6 = pcVar5;
    *pcVar6 = *(char *)(zero + lVar2 % 10);
    pcVar5 = pcVar6 + 1;
    uVar3 = lVar2 + 9;
    lVar2 = lVar2 / 10;
  } while (0x12 < uVar3);
  if (value != 0) {
    *pcVar5 = '-';
    pcVar5 = pcVar6 + 2;
  }
  *pcVar5 = '\0';
  pcVar6 = pcVar5 + -1;
  if (buf < pcVar6 && (long)pcVar5 - (long)buf != 0) {
    pcVar4 = buf + 1;
    do {
      cVar1 = pcVar4[-1];
      pcVar4[-1] = *pcVar6;
      *pcVar6 = cVar1;
      pcVar6 = pcVar6 + -1;
      bVar7 = pcVar4 < pcVar6;
      pcVar4 = pcVar4 + 1;
    } while (bVar7);
  }
  return (long)pcVar5 - (long)buf;
}

Assistant:

size_t convert(char buf[],T value){ //将数值转换为字符串
	T i = value;
	char* p = buf;

	do{
		int lsd = static_cast<int>(i % 10);
		i /= 10;
		*p++ = zero[lsd];
		
	}while(i != 0);

	if(value << 0){
		*p++ = '-';
	}

	*p = '\0';

	std::reverse(buf,p);

	return p - buf;
}